

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void get_mv_projection(MV *output,MV ref,int num,int den)

{
  int iVar1;
  uint uVar2;
  int16_t iVar3;
  int iVar4;
  uint uVar5;
  
  if (0x1e < den) {
    den = 0x1f;
  }
  if (num < 1) {
    iVar1 = -0x1f;
    if (-0x1f < num) {
      iVar1 = num;
    }
  }
  else {
    iVar1 = 0x1f;
    if ((uint)num < 0x1f) {
      iVar1 = num;
    }
  }
  iVar4 = (int)ref.row * iVar1 * div_mult[den];
  if (iVar4 < 0) {
    uVar5 = -(0x2000U - iVar4 >> 0xe);
  }
  else {
    uVar5 = iVar4 + 0x2000U >> 0xe;
  }
  iVar1 = iVar1 * div_mult[den] * ((int)ref >> 0x10);
  if (iVar1 < 0) {
    uVar2 = -(0x2000U - iVar1 >> 0xe);
  }
  else {
    uVar2 = iVar1 + 0x2000U >> 0xe;
  }
  if (0x3ffe < (int)uVar5) {
    uVar5 = 0x3fff;
  }
  iVar3 = (int16_t)uVar5;
  if ((int)uVar5 < -0x3ffe) {
    iVar3 = -0x3fff;
  }
  output->row = iVar3;
  uVar5 = 0x3fff;
  if ((int)uVar2 < 0x3fff) {
    uVar5 = uVar2;
  }
  iVar3 = (int16_t)uVar5;
  if ((int)uVar5 < -0x3ffe) {
    iVar3 = -0x3fff;
  }
  output->col = iVar3;
  return;
}

Assistant:

static inline void get_mv_projection(MV *output, MV ref, int num, int den) {
  den = AOMMIN(den, MAX_FRAME_DISTANCE);
  num = num > 0 ? AOMMIN(num, MAX_FRAME_DISTANCE)
                : AOMMAX(num, -MAX_FRAME_DISTANCE);
  const int mv_row =
      ROUND_POWER_OF_TWO_SIGNED(ref.row * num * div_mult[den], 14);
  const int mv_col =
      ROUND_POWER_OF_TWO_SIGNED(ref.col * num * div_mult[den], 14);
  const int clamp_max = MV_UPP - 1;
  const int clamp_min = MV_LOW + 1;
  output->row = (int16_t)clamp(mv_row, clamp_min, clamp_max);
  output->col = (int16_t)clamp(mv_col, clamp_min, clamp_max);
}